

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketnonblocking.cpp
# Opt level: O0

int __thiscall hbm::SocketNonblocking::init(SocketNonblocking *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int opt;
  int retVal;
  undefined4 local_10;
  int local_c;
  SocketNonblocking *local_8;
  
  local_c = 0;
  local_10 = 1;
  local_8 = this;
  iVar1 = socket(2,0x801,0);
  this->m_fd = iVar1;
  if (this->m_fd == -1) {
    local_c = -1;
  }
  else {
    setsockopt(this->m_fd,6,1,&local_10,4);
    local_10 = 0xc;
    setsockopt(this->m_fd,6,4,&local_10,4);
    local_10 = 3;
    setsockopt(this->m_fd,6,5,&local_10,4);
    local_10 = 2;
    setsockopt(this->m_fd,6,6,&local_10,4);
    local_10 = 1;
    setsockopt(this->m_fd,1,9,&local_10,4);
  }
  return local_c;
}

Assistant:

int hbm::SocketNonblocking::init()
{
	int retVal = 0;
	int opt = 1;

	m_fd = ::socket(AF_INET, SOCK_STREAM | SOCK_NONBLOCK, 0);
	if(m_fd==-1) {
		retVal=-1;
	} else {
		// turn off Nagle algorithm
		setsockopt(m_fd, IPPROTO_TCP, TCP_NODELAY, reinterpret_cast<char*>(&opt), sizeof(opt));

		opt = 12;
		// the interval between the last data packet sent (simple ACKs are not considered data) and the first keepalive probe;
		// after the connection is marked to need keepalive, this counter is not used any further
		setsockopt(m_fd, SOL_TCP, TCP_KEEPIDLE, reinterpret_cast<char*>(&opt), sizeof(opt));

		opt = 3;
		// the interval between subsequential keepalive probes, regardless of what the connection has exchanged in the meantime
		setsockopt(m_fd, SOL_TCP, TCP_KEEPINTVL, reinterpret_cast<char*>(&opt), sizeof(opt));

		opt = 2;
		// the number of unacknowledged probes to send before considering the connection dead and notifying the application layer
		setsockopt(m_fd, SOL_TCP, TCP_KEEPCNT, reinterpret_cast<char*>(&opt), sizeof(opt));

		opt = 1;
		setsockopt(m_fd, SOL_SOCKET, SO_KEEPALIVE, reinterpret_cast<char*>(&opt), sizeof(opt));
	}

	return retVal;
}